

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dir.cpp
# Opt level: O2

void just_test_test_case_f_test_path_is_not_empty(void)

{
  directory d;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  assert_not_equal local_50;
  directory local_28;
  
  just::temp::directory::directory(&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/temp/test/test_dir.cpp"
             ,&local_91);
  std::__cxx11::string::string((string *)&local_50,local_70);
  local_50._assert_msg._line = 0x2f;
  std::__cxx11::string::string((string *)&local_90,(string *)&local_28);
  just::test::assert_not_equal::operator()(&local_50,"",&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_70);
  just::temp::directory::~directory(&local_28);
  return;
}

Assistant:

JUST_TEST_CASE(test_path_is_not_empty)
{
  const temp::directory d;

  JUST_ASSERT_NOT_EQUAL("", d.path());
}